

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int *piVar7;
  Layer *pLVar8;
  undefined4 *puVar9;
  void *pvVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined3 uVar14;
  int iVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint _w;
  int iVar26;
  byte bVar27;
  uint uVar28;
  Option *pOVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  size_t _elemsize;
  void *pvVar34;
  bool bVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  float fVar38;
  float fVar42;
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar44;
  float fVar52;
  float fVar53;
  undefined1 auVar45 [16];
  float fVar54;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_218;
  undefined4 local_208;
  Mat local_1f8;
  Mat local_1a8;
  Mat local_158;
  void *local_108;
  int *local_100;
  Allocator *local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  ulong local_c8;
  pointer local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  undefined4 local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  if ((opt->use_int8_inference == true) && ((this->super_ConvolutionDepthWise).int8_scale_term != 0)
     ) {
    iVar17 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar17;
  }
  uVar22 = bottom_blob->c;
  uVar32 = bottom_blob->elemsize;
  iVar17 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar33 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar6 = (this->super_ConvolutionDepthWise).dilation_h;
  iVar26 = bottom_blob->elempack;
  local_1a8.cstep = 0;
  local_1a8.data = (void *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize._0_4_ = 0;
  local_1a8.elemsize._4_4_ = 0;
  local_1a8.elempack = 0;
  local_1a8.allocator = (Allocator *)0x0;
  local_1a8.dims = 0;
  local_1a8.w = 0;
  local_1a8.h = 0;
  local_1a8.d = 0;
  local_1a8.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,bottom_blob,&local_1a8,opt);
  iVar15 = local_1a8.w;
  iVar19 = -100;
  if ((local_1a8.data == (void *)0x0) || ((long)local_1a8.c * local_1a8.cstep == 0))
  goto LAB_003f78cf;
  iVar17 = (~((iVar17 + -1) * iVar33) + local_1a8.w) / (this->super_ConvolutionDepthWise).stride_w;
  _w = iVar17 + 1;
  iVar33 = (~((iVar21 + -1) * iVar6) + local_1a8.h) / (this->super_ConvolutionDepthWise).stride_h;
  uVar25 = (this->super_ConvolutionDepthWise).num_output;
  uVar31 = 1;
  if (opt->use_packing_layout == true) {
    uVar31 = 8;
    if ((uVar25 & 7) != 0) {
      uVar31 = (ulong)((uVar25 & 3) == 0) * 3 + 1;
    }
  }
  uVar18 = (uint)uVar31;
  _elemsize = (uVar32 / (ulong)(long)iVar26) * uVar31;
  Mat::create(top_blob,_w,iVar33 + 1,(int)uVar25 / (int)uVar18,_elemsize,uVar18,opt->blob_allocator)
  ;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_003f78cf;
  iVar21 = (this->super_ConvolutionDepthWise).num_output;
  iVar6 = (this->super_ConvolutionDepthWise).group;
  if (iVar6 != iVar21 || iVar26 * uVar22 != iVar6) {
LAB_003f70d8:
    uVar32 = (long)(int)(iVar26 * uVar22) / (long)iVar6;
    uVar25 = iVar21 / iVar6;
    iVar17 = 1;
    uVar22 = 1;
    if (opt->use_packing_layout == true) {
      iVar17 = (uint)((uVar32 & 3) == 0) * 3 + 1;
      if ((uVar32 & 7) == 0) {
        iVar17 = 8;
      }
      uVar22 = (uint)((uVar25 & 3) == 0) * 3 + 1;
      if ((uVar25 & 7) == 0) {
        uVar22 = 8;
      }
    }
    piVar7 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    local_158.refcount = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    local_158.data = local_1a8.data;
    local_158.elemsize = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
    local_158.elempack = local_1a8.elempack;
    local_158.allocator = local_1a8.allocator;
    local_158.w = local_1a8.w;
    local_158.dims = local_1a8.dims;
    local_158.d = local_1a8.d;
    local_158.h = local_1a8.h;
    local_158.c = local_1a8.c;
    local_158.cstep = local_1a8.cstep;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    if (iVar17 < iVar26) {
      local_1f8.data = *(void **)opt;
      local_1f8.elemsize = (size_t)opt->workspace_allocator;
      local_1f8.elempack = opt->openmp_blocktime;
      local_1f8._28_1_ = opt->use_winograd_convolution;
      local_1f8._29_1_ = opt->use_sgemm_convolution;
      local_1f8._30_1_ = opt->use_int8_inference;
      local_1f8._31_1_ = opt->use_vulkan_compute;
      local_1f8.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_1f8._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
      local_1f8._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_1f8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
      local_1f8.refcount = (int *)opt->workspace_allocator;
      convert_packing(&local_1a8,&local_158,iVar17,(Option *)&local_1f8);
      if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0))
      goto LAB_003f7232;
      iVar19 = -100;
    }
    else {
LAB_003f7232:
      piVar7 = top_blob->refcount;
      local_1f8.data = top_blob->data;
      local_1f8.refcount = top_blob->refcount;
      local_1f8.elemsize = top_blob->elemsize;
      local_1f8.elempack = top_blob->elempack;
      local_1f8.allocator = top_blob->allocator;
      local_1f8.dims = top_blob->dims;
      local_1f8.w = top_blob->w;
      local_1f8.h = top_blob->h;
      local_1f8.d = top_blob->d;
      local_1f8.c = top_blob->c;
      local_1f8.cstep = top_blob->cstep;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      if (uVar22 < uVar18) {
        Mat::create(&local_1f8,_w,iVar33 + 1,
                    (this->super_ConvolutionDepthWise).num_output / (int)uVar22,
                    (ulong)uVar22 * (_elemsize / uVar31),uVar22,opt->workspace_allocator);
        iVar19 = -100;
        if ((local_1f8.data != (void *)0x0) && ((long)local_1f8.c * local_1f8.cstep != 0))
        goto LAB_003f72ff;
      }
      else {
LAB_003f72ff:
        if (0 < (this->super_ConvolutionDepthWise).group) {
          iVar33 = 0;
          iVar21 = 0;
          lVar30 = 0;
          do {
            local_c0 = (pointer)((long)(iVar33 / iVar17) * local_158.cstep * local_158.elemsize +
                                (long)local_158.data);
            local_b8 = (int *)0x0;
            local_b0 = local_158.elemsize;
            local_a8 = local_158.elempack;
            local_a0 = local_158.allocator;
            local_208 = (undefined4)
                        ((long)((ulong)(uint)((int)uVar32 >> 0x1f) << 0x20 | uVar32 & 0xffffffff) /
                        (long)iVar17);
            local_88 = local_208;
            local_80 = ((long)local_158.d * local_158.elemsize *
                        (long)local_158.h * (long)local_158.w + 0xf & 0xfffffffffffffff0) /
                       local_158.elemsize;
            local_98 = local_158.dims;
            iStack_94 = local_158.w;
            iStack_90 = local_158.h;
            iStack_8c = local_158.d;
            local_108 = (void *)((long)(iVar21 / (int)uVar22) * local_1f8.cstep * local_1f8.elemsize
                                + (long)local_1f8.data);
            local_100 = (int *)0x0;
            local_f8 = (Allocator *)local_1f8.elemsize;
            local_f0 = local_1f8.elempack;
            local_e8 = local_1f8.allocator;
            local_c8 = ((long)local_1f8.d * local_1f8.elemsize *
                        (long)local_1f8.h * (long)local_1f8.w + 0xf & 0xfffffffffffffff0) /
                       local_1f8.elemsize;
            local_e0 = local_1f8.dims;
            iStack_dc = local_1f8.w;
            iStack_d8 = local_1f8.h;
            iStack_d4 = local_1f8.d;
            pLVar8 = (this->group_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar30];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            pAStack_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            local_58._0_1_ = opt->use_bf16_storage;
            local_58._1_1_ = opt->use_fp16_packed;
            local_58._2_1_ = opt->use_fp16_storage;
            local_58._3_1_ = opt->use_fp16_arithmetic;
            local_58._4_1_ = opt->use_int8_packed;
            local_58._5_1_ = opt->use_int8_storage;
            local_58._6_1_ = opt->use_int8_arithmetic;
            local_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            uStack_48._0_4_ = opt->flush_denormals;
            uStack_48._4_1_ = opt->use_local_pool_allocator;
            uStack_48._5_1_ = opt->use_shader_local_memory;
            uStack_48._6_1_ = opt->use_cooperative_matrix;
            uStack_48._7_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_40._4_1_ = opt->use_int8_uniform;
            uStack_40._5_1_ = opt->use_reserved_9;
            uStack_40._6_1_ = opt->use_reserved_10;
            uStack_40._7_1_ = opt->use_reserved_11;
            pAStack_70 = local_1f8.allocator;
            local_d0 = (int)uVar25 / (int)uVar22;
            iVar19 = (*pLVar8->_vptr_Layer[7])(pLVar8,&local_c0,&local_108,&local_78);
            if (local_100 != (int *)0x0) {
              LOCK();
              *local_100 = *local_100 + -1;
              UNLOCK();
              if (*local_100 == 0) {
                if (local_e8 == (Allocator *)0x0) {
                  if (local_108 != (void *)0x0) {
                    free(local_108);
                  }
                }
                else {
                  (*local_e8->_vptr_Allocator[3])();
                }
              }
            }
            if (local_b8 != (int *)0x0) {
              LOCK();
              *local_b8 = *local_b8 + -1;
              UNLOCK();
              if (*local_b8 == 0) {
                if (local_a0 == (Allocator *)0x0) {
                  if (local_c0 != (pointer)0x0) {
                    free(local_c0);
                  }
                }
                else {
                  (*local_a0->_vptr_Allocator[3])();
                }
              }
            }
            if (iVar19 != 0) goto LAB_003f785d;
            lVar30 = lVar30 + 1;
            iVar21 = iVar21 + uVar25;
            iVar33 = iVar33 + (int)uVar32;
          } while (lVar30 < (this->super_ConvolutionDepthWise).group);
        }
        if (uVar22 < uVar18) {
          convert_packing(&local_1f8,top_blob,uVar18,opt);
          iVar19 = -100;
          if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
          goto LAB_003f785d;
        }
        else if (&local_1f8 != top_blob) {
          if ((Allocator *)local_1f8.refcount != (Allocator *)0x0) {
            LOCK();
            *(int *)(_func_int ***)local_1f8.refcount =
                 *(int *)(_func_int ***)local_1f8.refcount + 1;
            UNLOCK();
          }
          piVar7 = top_blob->refcount;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_1f8.data;
          top_blob->refcount = local_1f8.refcount;
          top_blob->elemsize = local_1f8.elemsize;
          top_blob->elempack = local_1f8.elempack;
          top_blob->allocator = local_1f8.allocator;
          top_blob->dims = local_1f8.dims;
          top_blob->w = local_1f8.w;
          top_blob->h = local_1f8.h;
          top_blob->d = local_1f8.d;
          top_blob->c = local_1f8.c;
          top_blob->cstep = local_1f8.cstep;
        }
        iVar19 = 0;
      }
LAB_003f785d:
      if ((Allocator *)local_1f8.refcount != (Allocator *)0x0) {
        LOCK();
        *(int *)(_func_int ***)local_1f8.refcount = *(int *)(_func_int ***)local_1f8.refcount + -1;
        UNLOCK();
        if (*(int *)(_func_int ***)local_1f8.refcount == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) {
            if (local_1f8.data != (void *)0x0) {
              free(local_1f8.data);
            }
          }
          else {
            (*(local_1f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (local_158.refcount != (int *)0x0) {
      LOCK();
      *local_158.refcount = *local_158.refcount + -1;
      UNLOCK();
      if (*local_158.refcount == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_003f78cf;
  }
  if (iVar26 == 1) {
    auVar67._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar67._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar67._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar67._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar67 = vpcmpeqd_avx(auVar67,_DAT_005a64c0);
    uVar28 = vmovmskps_avx(auVar67);
    iVar17 = (this->super_ConvolutionDepthWise).stride_w;
    uVar25 = (this->super_ConvolutionDepthWise).stride_h;
    if (uVar25 == 1 && (iVar17 == 1 && (uVar28 ^ 0xf) == 0)) {
      convdw3x3s1_sse(&local_1a8,top_blob,(Mat *)(this->weight_data_tm).data,
                      (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                      (Option *)(ulong)uVar25);
    }
    else {
      bVar35 = (char)(uVar28 ^ 0xf) == '\0';
      if ((uVar25 != 2 || iVar17 != 2) || !bVar35) goto LAB_003f70d8;
      convdw3x3s2_sse(&local_1a8,top_blob,(Mat *)(this->weight_data_tm).data,
                      (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                      (Option *)
                      (ulong)CONCAT31((int3)(uVar25 >> 8),(uVar25 == 2 && iVar17 == 2) && bVar35));
    }
LAB_003f77de:
    pLVar8 = this->activation;
    if (pLVar8 != (Layer *)0x0) {
      (*pLVar8->_vptr_Layer[9])(pLVar8,top_blob,opt);
    }
  }
  else {
    if (iVar26 != 4) {
      if (iVar26 != 8) goto LAB_003f70d8;
      auVar76._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
      auVar76._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
      auVar76._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
      auVar76._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
      auVar67 = vpcmpeqd_avx(auVar76,_DAT_005a64c0);
      uVar18 = vmovmskps_avx(auVar67);
      uVar25 = (this->super_ConvolutionDepthWise).stride_w;
      uVar28 = uVar25 ^ 1 | uVar18 ^ 0xf;
      iVar21 = (this->super_ConvolutionDepthWise).stride_h;
      if (iVar21 == 1 && uVar28 == 0) {
        convdw3x3s1_pack8_avx
                  (&local_1a8,top_blob,&this->weight_data_tm,
                   (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,(Option *)(ulong)uVar28)
        ;
      }
      else {
        bVar16 = (byte)uVar18;
        uVar14 = (undefined3)(uVar28 >> 8);
        if ((iVar21 == 2 && uVar25 == 2) && bVar16 == 0xf) {
          convdw3x3s2_pack8_avx
                    (&local_1a8,top_blob,&this->weight_data_tm,
                     (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                     (Option *)(ulong)CONCAT31(uVar14,(iVar21 == 2 && uVar25 == 2) && bVar16 == 0xf)
                    );
        }
        else {
          bVar16 = bVar16 >> 2 & bVar16 >> 3 & (auVar76._4_4_ == 5 && auVar76._0_4_ == 5);
          bVar27 = (uVar25 == 1 && iVar21 == 1) & bVar16;
          pOVar29 = (Option *)(ulong)CONCAT31(uVar14,bVar27);
          if (bVar27 == 1) {
            convdw5x5s1_pack8_avx
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar29);
          }
          else {
            if ((bVar16 & (uVar25 == 2 && iVar21 == 2)) != 1) {
              uVar25 = auVar76._4_4_ * auVar76._0_4_;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_158,(long)(int)uVar25,
                         (allocator_type *)&local_1f8);
              iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
              if (0 < iVar21) {
                iVar6 = (this->super_ConvolutionDepthWise).dilation_h;
                iVar26 = (this->super_ConvolutionDepthWise).kernel_w;
                iVar19 = (this->super_ConvolutionDepthWise).dilation_w * iVar26;
                iVar20 = 0;
                iVar23 = 0;
                iVar24 = 0;
                do {
                  if (0 < iVar26) {
                    lVar30 = 0;
                    do {
                      *(int *)((long)local_158.data + (iVar20 + lVar30) * 4) = iVar23;
                      iVar23 = iVar23 + (this->super_ConvolutionDepthWise).dilation_w;
                      iVar26 = (this->super_ConvolutionDepthWise).kernel_w;
                      lVar30 = lVar30 + 1;
                    } while ((int)lVar30 < iVar26);
                    iVar20 = iVar20 + (int)lVar30;
                    iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
                  }
                  iVar23 = iVar23 + (iVar15 * iVar6 - iVar19);
                  iVar24 = iVar24 + 1;
                } while (iVar24 < iVar21);
              }
              if (0 < (int)uVar22) {
                iVar21 = 0;
                local_218 = 0;
                do {
                  if (-1 < iVar33) {
                    pvVar34 = (void *)(top_blob->cstep * local_218 * top_blob->elemsize +
                                      (long)top_blob->data);
                    pvVar10 = (this->weight_data_tm).data;
                    iVar6 = 0;
                    do {
                      if (-1 < iVar17) {
                        uVar32 = 0;
                        do {
                          if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                            auVar37 = ZEXT1664((undefined1  [16])0x0);
                          }
                          else {
                            auVar37 = ZEXT3264(*(undefined1 (*) [32])
                                                ((long)(this->super_ConvolutionDepthWise).bias_data.
                                                       data + local_218 * 0x20));
                          }
                          auVar36 = auVar37._0_32_;
                          if (0 < (int)uVar25) {
                            lVar30 = 0;
                            do {
                              pfVar1 = (float *)((long)pvVar10 + lVar30 * 8 + (long)iVar21 * 4);
                              pfVar2 = (float *)((long)local_1a8.data +
                                                (long)*(int *)((long)local_158.data + lVar30) * 0x20
                                                + (long)((this->super_ConvolutionDepthWise).stride_w
                                                         * (int)uVar32 * 8) * 4 +
                                                  (long)(this->super_ConvolutionDepthWise).stride_h
                                                  * (long)iVar6 *
                                                  (long)local_1a8.w *
                                                  CONCAT44(local_1a8.elemsize._4_4_,
                                                           (undefined4)local_1a8.elemsize) +
                                                  local_1a8.cstep * local_218 *
                                                  CONCAT44(local_1a8.elemsize._4_4_,
                                                           (undefined4)local_1a8.elemsize));
                              auVar36._0_4_ = *pfVar1 * *pfVar2 + auVar37._0_4_;
                              auVar36._4_4_ = pfVar1[1] * pfVar2[1] + auVar37._4_4_;
                              auVar36._8_4_ = pfVar1[2] * pfVar2[2] + auVar37._8_4_;
                              auVar36._12_4_ = pfVar1[3] * pfVar2[3] + auVar37._12_4_;
                              auVar36._16_4_ = pfVar1[4] * pfVar2[4] + auVar37._16_4_;
                              auVar36._20_4_ = pfVar1[5] * pfVar2[5] + auVar37._20_4_;
                              auVar36._24_4_ = pfVar1[6] * pfVar2[6] + auVar37._24_4_;
                              auVar36._28_4_ = pfVar1[7] + auVar37._28_4_;
                              auVar37 = ZEXT3264(auVar36);
                              lVar30 = lVar30 + 4;
                            } while ((ulong)uVar25 << 2 != lVar30);
                          }
                          *(undefined1 (*) [32])((long)pvVar34 + uVar32 * 0x20) = auVar36;
                          uVar32 = uVar32 + 1;
                        } while (uVar32 != _w);
                      }
                      pvVar34 = (void *)((long)pvVar34 + (long)(int)(_w * 8) * 4);
                      bVar35 = iVar6 != iVar33;
                      iVar6 = iVar6 + 1;
                    } while (bVar35);
                  }
                  local_218 = local_218 + 1;
                  iVar21 = iVar21 + uVar25 * 8;
                } while (local_218 != uVar22);
              }
              pLVar8 = this->activation;
              if (pLVar8 != (Layer *)0x0) {
                (*pLVar8->_vptr_Layer[9])(pLVar8,top_blob,opt);
              }
              goto LAB_003f8200;
            }
            convdw5x5s2_pack8_avx
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar29);
          }
        }
      }
      goto LAB_003f77de;
    }
    auVar13._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar13._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar13._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar13._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar67 = vpcmpeqd_avx(auVar13,_DAT_005a64c0);
    uVar18 = vmovmskps_avx(auVar67);
    uVar25 = (this->super_ConvolutionDepthWise).stride_w;
    uVar28 = uVar25 ^ 1 | uVar18 ^ 0xf;
    iVar21 = (this->super_ConvolutionDepthWise).stride_h;
    if (iVar21 == 1 && uVar28 == 0) {
      convdw3x3s1_pack4_sse
                (&local_1a8,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,(Option *)(ulong)uVar28);
      goto LAB_003f77de;
    }
    bVar16 = (byte)uVar18;
    uVar14 = (undefined3)(uVar28 >> 8);
    if ((iVar21 == 2 && uVar25 == 2) && bVar16 == 0xf) {
      convdw3x3s2_pack4_sse
                (&local_1a8,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                 (Option *)(ulong)CONCAT31(uVar14,(iVar21 == 2 && uVar25 == 2) && bVar16 == 0xf));
      goto LAB_003f77de;
    }
    bVar16 = bVar16 >> 2 & bVar16 >> 3 & (auVar13._4_4_ == 5 && auVar13._0_4_ == 5);
    bVar27 = (uVar25 == 1 && iVar21 == 1) & bVar16;
    pOVar29 = (Option *)(ulong)CONCAT31(uVar14,bVar27);
    if (bVar27 == 1) {
      convdw5x5s1_pack4_sse
                (&local_1a8,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar29);
      goto LAB_003f77de;
    }
    if ((bVar16 & (uVar25 == 2 && iVar21 == 2)) == 1) {
      convdw5x5s2_pack4_sse
                (&local_1a8,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar29);
      goto LAB_003f77de;
    }
    uVar25 = auVar13._4_4_ * auVar13._0_4_;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_158,(long)(int)uVar25,
               (allocator_type *)&local_1f8);
    iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
    if (0 < iVar21) {
      iVar6 = (this->super_ConvolutionDepthWise).dilation_h;
      iVar26 = (this->super_ConvolutionDepthWise).kernel_w;
      iVar19 = (this->super_ConvolutionDepthWise).dilation_w * iVar26;
      iVar20 = 0;
      iVar23 = 0;
      iVar24 = 0;
      do {
        if (0 < iVar26) {
          lVar30 = 0;
          do {
            *(int *)((long)local_158.data + (iVar24 + lVar30) * 4) = iVar23;
            iVar23 = iVar23 + (this->super_ConvolutionDepthWise).dilation_w;
            iVar26 = (this->super_ConvolutionDepthWise).kernel_w;
            lVar30 = lVar30 + 1;
          } while ((int)lVar30 < iVar26);
          iVar24 = iVar24 + (int)lVar30;
          iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
        }
        iVar23 = iVar23 + (iVar15 * iVar6 - iVar19);
        iVar20 = iVar20 + 1;
      } while (iVar20 < iVar21);
    }
    if (0 < (int)uVar22) {
      iVar21 = 0;
      auVar37 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar65._8_4_ = 0x3f800000;
      auVar65._0_8_ = 0x3f8000003f800000;
      auVar65._12_4_ = 0x3f800000;
      local_218 = 0;
      do {
        if (-1 < iVar33) {
          pvVar34 = (void *)(top_blob->cstep * local_218 * top_blob->elemsize + (long)top_blob->data
                            );
          pvVar10 = (this->weight_data_tm).data;
          iVar6 = 0;
          do {
            if (-1 < iVar17) {
              uVar32 = 0;
              do {
                if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                  auVar39 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar39 = *(undefined1 (*) [16])
                             ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                             local_218 * 0x10);
                }
                if (0 < (int)uVar25) {
                  lVar30 = 0;
                  auVar67 = auVar39;
                  do {
                    pfVar1 = (float *)((long)pvVar10 + lVar30 * 4 + (long)iVar21 * 4);
                    pfVar2 = (float *)((long)local_1a8.data +
                                      (long)*(int *)((long)local_158.data + lVar30) * 0x10 +
                                      (long)((this->super_ConvolutionDepthWise).stride_w *
                                             (int)uVar32 * 4) * 4 +
                                      (long)(this->super_ConvolutionDepthWise).stride_h *
                                      (long)iVar6 *
                                      (long)local_1a8.w *
                                      CONCAT44(local_1a8.elemsize._4_4_,
                                               (undefined4)local_1a8.elemsize) +
                                      local_1a8.cstep * local_218 *
                                      CONCAT44(local_1a8.elemsize._4_4_,
                                               (undefined4)local_1a8.elemsize));
                    auVar39._0_4_ = *pfVar1 * *pfVar2 + auVar67._0_4_;
                    auVar39._4_4_ = pfVar1[1] * pfVar2[1] + auVar67._4_4_;
                    auVar39._8_4_ = pfVar1[2] * pfVar2[2] + auVar67._8_4_;
                    auVar39._12_4_ = pfVar1[3] * pfVar2[3] + auVar67._12_4_;
                    lVar30 = lVar30 + 4;
                    auVar67 = auVar39;
                  } while ((ulong)uVar25 << 2 != lVar30);
                }
                fVar4 = auVar37._0_4_;
                fVar5 = auVar37._4_4_;
                fVar11 = auVar37._8_4_;
                fVar12 = auVar37._12_4_;
                fVar38 = auVar39._4_4_;
                fVar42 = auVar39._8_4_;
                fVar43 = auVar39._12_4_;
                switch((this->super_ConvolutionDepthWise).activation_type) {
                case 1:
                  auVar39 = vmaxps_avx(auVar39,_DAT_005a4060);
                  break;
                case 2:
                  auVar67 = vmaxps_avx(auVar39,(undefined1  [16])0x0);
                  auVar76 = vminps_avx(auVar39,(undefined1  [16])0x0);
                  fVar4 = *(this->super_ConvolutionDepthWise).activation_params.data;
                  auVar39._0_4_ = fVar4 * auVar76._0_4_ + auVar67._0_4_;
                  auVar39._4_4_ = fVar4 * auVar76._4_4_ + auVar67._4_4_;
                  auVar39._8_4_ = fVar4 * auVar76._8_4_ + auVar67._8_4_;
                  auVar39._12_4_ = fVar4 * auVar76._12_4_ + auVar67._12_4_;
                  break;
                case 3:
                  puVar9 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
                  uVar3 = *puVar9;
                  auVar71._4_4_ = uVar3;
                  auVar71._0_4_ = uVar3;
                  auVar71._8_4_ = uVar3;
                  auVar71._12_4_ = uVar3;
                  uVar3 = puVar9[1];
                  auVar79._4_4_ = uVar3;
                  auVar79._0_4_ = uVar3;
                  auVar79._8_4_ = uVar3;
                  auVar79._12_4_ = uVar3;
                  auVar67 = vmaxps_avx(auVar39,auVar71);
                  auVar39 = vminps_avx(auVar79,auVar67);
                  break;
                case 4:
                  auVar40._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
                  auVar40._8_4_ = -fVar42;
                  auVar40._12_4_ = -fVar43;
                  auVar49._8_4_ = 0x42b0c0a5;
                  auVar49._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar49._12_4_ = 0x42b0c0a5;
                  auVar67 = vminps_avx(auVar40,auVar49);
                  auVar50._8_4_ = 0xc2b0c0a5;
                  auVar50._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar50._12_4_ = 0xc2b0c0a5;
                  auVar13 = vmaxps_avx(auVar67,auVar50);
                  auVar72._0_4_ = fVar4 + auVar13._0_4_ * 1.442695;
                  auVar72._4_4_ = fVar5 + auVar13._4_4_ * 1.442695;
                  auVar72._8_4_ = fVar11 + auVar13._8_4_ * 1.442695;
                  auVar72._12_4_ = fVar12 + auVar13._12_4_ * 1.442695;
                  auVar80._0_4_ = (int)auVar72._0_4_;
                  auVar80._4_4_ = (int)auVar72._4_4_;
                  auVar80._8_4_ = (int)auVar72._8_4_;
                  auVar80._12_4_ = (int)auVar72._12_4_;
                  auVar76 = vcvtdq2ps_avx(auVar80);
                  auVar67 = vcmpps_avx(auVar72,auVar76,1);
                  auVar67 = vandps_avx(auVar67,auVar65);
                  auVar67 = vsubps_avx(auVar76,auVar67);
                  fVar38 = auVar67._0_4_ * -0.6931472 + auVar13._0_4_;
                  fVar42 = auVar67._4_4_ * -0.6931472 + auVar13._4_4_;
                  fVar43 = auVar67._8_4_ * -0.6931472 + auVar13._8_4_;
                  fVar44 = auVar67._12_4_ * -0.6931472 + auVar13._12_4_;
                  auVar73._0_4_ = (int)auVar67._0_4_;
                  auVar73._4_4_ = (int)auVar67._4_4_;
                  auVar73._8_4_ = (int)auVar67._8_4_;
                  auVar73._12_4_ = (int)auVar67._12_4_;
                  auVar67 = vpslld_avx(auVar73,0x17);
                  auVar67 = vpaddd_avx(auVar67,auVar65);
                  auVar41._0_4_ =
                       (fVar38 * fVar38 *
                        (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38
                          + 0.041665796) * fVar38 + 0.16666666) * fVar38 + fVar4) + fVar38 + 1.0) *
                       auVar67._0_4_ + 1.0;
                  auVar41._4_4_ =
                       (fVar42 * fVar42 *
                        (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42
                          + 0.041665796) * fVar42 + 0.16666666) * fVar42 + fVar5) + fVar42 + 1.0) *
                       auVar67._4_4_ + 1.0;
                  auVar41._8_4_ =
                       (fVar43 * fVar43 *
                        (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43
                          + 0.041665796) * fVar43 + 0.16666666) * fVar43 + fVar11) + fVar43 + 1.0) *
                       auVar67._8_4_ + 1.0;
                  auVar41._12_4_ =
                       (fVar44 * fVar44 *
                        (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44
                          + 0.041665796) * fVar44 + 0.16666666) * fVar44 + fVar12) + fVar44 + 1.0) *
                       auVar67._12_4_ + 1.0;
                  auVar39 = vdivps_avx(auVar65,auVar41);
                  break;
                case 5:
                  auVar64._8_4_ = 0x42b0c0a5;
                  auVar64._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar64._12_4_ = 0x42b0c0a5;
                  auVar67 = vminps_avx(auVar39,auVar64);
                  auVar74._8_4_ = 0xc2b0c0a5;
                  auVar74._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar74._12_4_ = 0xc2b0c0a5;
                  auVar13 = vmaxps_avx(auVar74,auVar67);
                  auVar75._0_4_ = auVar13._0_4_ * 1.442695 + fVar4;
                  auVar75._4_4_ = auVar13._4_4_ * 1.442695 + fVar5;
                  auVar75._8_4_ = auVar13._8_4_ * 1.442695 + fVar11;
                  auVar75._12_4_ = auVar13._12_4_ * 1.442695 + fVar12;
                  auVar77._0_4_ = (int)auVar75._0_4_;
                  auVar77._4_4_ = (int)auVar75._4_4_;
                  auVar77._8_4_ = (int)auVar75._8_4_;
                  auVar77._12_4_ = (int)auVar75._12_4_;
                  auVar76 = vcvtdq2ps_avx(auVar77);
                  auVar67 = vcmpps_avx(auVar75,auVar76,1);
                  auVar67 = vandps_avx(auVar67,auVar65);
                  auVar67 = vsubps_avx(auVar76,auVar67);
                  auVar78._0_4_ = auVar67._0_4_ * 0.6931472;
                  auVar78._4_4_ = auVar67._4_4_ * 0.6931472;
                  auVar78._8_4_ = auVar67._8_4_ * 0.6931472;
                  auVar78._12_4_ = auVar67._12_4_ * 0.6931472;
                  auVar76 = vsubps_avx(auVar13,auVar78);
                  fVar44 = auVar76._0_4_;
                  fVar52 = auVar76._4_4_;
                  fVar53 = auVar76._8_4_;
                  fVar54 = auVar76._12_4_;
                  auVar66._0_4_ = (int)auVar67._0_4_;
                  auVar66._4_4_ = (int)auVar67._4_4_;
                  auVar66._8_4_ = (int)auVar67._8_4_;
                  auVar66._12_4_ = (int)auVar67._12_4_;
                  auVar67 = vpslld_avx(auVar66,0x17);
                  auVar67 = vpaddd_avx(auVar67,auVar65);
                  auVar68._0_4_ =
                       (fVar44 + 1.0 +
                       fVar44 * fVar44 *
                       (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44
                         + 0.041665796) * fVar44 + 0.16666666) * fVar44 + fVar4)) * auVar67._0_4_ +
                       1.0;
                  auVar68._4_4_ =
                       (fVar52 + 1.0 +
                       fVar52 * fVar52 *
                       (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) * fVar52
                         + 0.041665796) * fVar52 + 0.16666666) * fVar52 + fVar5)) * auVar67._4_4_ +
                       1.0;
                  auVar68._8_4_ =
                       (fVar53 + 1.0 +
                       fVar53 * fVar53 *
                       (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53
                         + 0.041665796) * fVar53 + 0.16666666) * fVar53 + fVar11)) * auVar67._8_4_ +
                       1.0;
                  auVar68._12_4_ =
                       (fVar54 + 1.0 +
                       fVar54 * fVar54 *
                       (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54
                         + 0.041665796) * fVar54 + 0.16666666) * fVar54 + fVar12)) * auVar67._12_4_
                       + 1.0;
                  auVar45._8_4_ = 0x800000;
                  auVar45._0_8_ = 0x80000000800000;
                  auVar45._12_4_ = 0x800000;
                  auVar67 = vmaxps_avx(auVar68,auVar45);
                  auVar76 = vpsrld_avx(auVar67,0x17);
                  auVar55._8_4_ = 0xffffff82;
                  auVar55._0_8_ = 0xffffff82ffffff82;
                  auVar55._12_4_ = 0xffffff82;
                  auVar76 = vpaddd_avx(auVar76,auVar55);
                  auVar56._8_4_ = 0x807fffff;
                  auVar56._0_8_ = 0x807fffff807fffff;
                  auVar56._12_4_ = 0x807fffff;
                  auVar67 = vandps_avx(auVar67,auVar56);
                  auVar48 = vorps_avx(auVar67,auVar37._0_16_);
                  auVar13 = vcvtdq2ps_avx(auVar76);
                  auVar57._8_4_ = 0x3f3504f3;
                  auVar57._0_8_ = 0x3f3504f33f3504f3;
                  auVar57._12_4_ = 0x3f3504f3;
                  auVar76 = vcmpps_avx(auVar48,auVar57,1);
                  auVar67 = vandps_avx(auVar76,auVar48);
                  fVar44 = auVar48._0_4_ + -1.0 + auVar67._0_4_;
                  fVar52 = auVar48._4_4_ + -1.0 + auVar67._4_4_;
                  fVar53 = auVar48._8_4_ + -1.0 + auVar67._8_4_;
                  fVar54 = auVar48._12_4_ + -1.0 + auVar67._12_4_;
                  auVar67 = vandps_avx(auVar76,auVar65);
                  auVar76 = vsubps_avx(auVar13,auVar67);
                  auVar67 = vcmpps_avx(auVar68,_DAT_005a4060,2);
                  auVar46._0_4_ =
                       (fVar44 * fVar44 *
                        (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44
                              + -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44
                           + 0.20000714) * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 +
                        -0.5) + auVar76._0_4_ * 0.6931472 + fVar44) * -2.0;
                  auVar46._4_4_ =
                       (fVar52 * fVar52 *
                        (((((((((fVar52 * 0.070376836 + -0.1151461) * fVar52 + 0.116769984) * fVar52
                              + -0.12420141) * fVar52 + 0.14249323) * fVar52 + -0.16668057) * fVar52
                           + 0.20000714) * fVar52 + -0.24999994) * fVar52 + 0.3333333) * fVar52 +
                        -0.5) + auVar76._4_4_ * 0.6931472 + fVar52) * -2.0;
                  auVar46._8_4_ =
                       (fVar53 * fVar53 *
                        (((((((((fVar53 * 0.070376836 + -0.1151461) * fVar53 + 0.116769984) * fVar53
                              + -0.12420141) * fVar53 + 0.14249323) * fVar53 + -0.16668057) * fVar53
                           + 0.20000714) * fVar53 + -0.24999994) * fVar53 + 0.3333333) * fVar53 +
                        -0.5) + auVar76._8_4_ * 0.6931472 + fVar53) * -2.0;
                  auVar46._12_4_ =
                       (fVar54 * fVar54 *
                        (((((((((fVar54 * 0.070376836 + -0.1151461) * fVar54 + 0.116769984) * fVar54
                              + -0.12420141) * fVar54 + 0.14249323) * fVar54 + -0.16668057) * fVar54
                           + 0.20000714) * fVar54 + -0.24999994) * fVar54 + 0.3333333) * fVar54 +
                        -0.5) + auVar76._12_4_ * 0.6931472 + fVar54) * -2.0;
                  auVar58._8_4_ = 0x7fffffff;
                  auVar58._0_8_ = 0x7fffffff7fffffff;
                  auVar58._12_4_ = 0x7fffffff;
                  auVar67 = vblendvps_avx(auVar46,auVar58,auVar67);
                  auVar59._8_4_ = 0x42b0c0a5;
                  auVar59._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar59._12_4_ = 0x42b0c0a5;
                  auVar67 = vminps_avx(auVar67,auVar59);
                  auVar60._8_4_ = 0xc2b0c0a5;
                  auVar60._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar60._12_4_ = 0xc2b0c0a5;
                  auVar13 = vmaxps_avx(auVar67,auVar60);
                  auVar61._0_4_ = auVar13._0_4_ * 1.442695 + fVar4;
                  auVar61._4_4_ = auVar13._4_4_ * 1.442695 + fVar5;
                  auVar61._8_4_ = auVar13._8_4_ * 1.442695 + fVar11;
                  auVar61._12_4_ = auVar13._12_4_ * 1.442695 + fVar12;
                  auVar69._0_4_ = (int)auVar61._0_4_;
                  auVar69._4_4_ = (int)auVar61._4_4_;
                  auVar69._8_4_ = (int)auVar61._8_4_;
                  auVar69._12_4_ = (int)auVar61._12_4_;
                  auVar76 = vcvtdq2ps_avx(auVar69);
                  auVar67 = vcmpps_avx(auVar61,auVar76,1);
                  auVar67 = vandps_avx(auVar67,auVar65);
                  auVar67 = vsubps_avx(auVar76,auVar67);
                  auVar70._0_4_ = auVar67._0_4_ * 0.6931472;
                  auVar70._4_4_ = auVar67._4_4_ * 0.6931472;
                  auVar70._8_4_ = auVar67._8_4_ * 0.6931472;
                  auVar70._12_4_ = auVar67._12_4_ * 0.6931472;
                  auVar76 = vsubps_avx(auVar13,auVar70);
                  fVar44 = auVar76._0_4_;
                  fVar52 = auVar76._4_4_;
                  fVar53 = auVar76._8_4_;
                  fVar54 = auVar76._12_4_;
                  auVar37 = ZEXT1664(auVar37._0_16_);
                  auVar62._0_4_ = (int)auVar67._0_4_;
                  auVar62._4_4_ = (int)auVar67._4_4_;
                  auVar62._8_4_ = (int)auVar67._8_4_;
                  auVar62._12_4_ = (int)auVar67._12_4_;
                  auVar67 = vpslld_avx(auVar62,0x17);
                  auVar67 = vpaddd_avx(auVar67,auVar65);
                  auVar47._0_4_ =
                       (fVar44 + 1.0 +
                       (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44
                         + 0.041665796) * fVar44 + 0.16666666) * fVar44 + fVar4) * fVar44 * fVar44)
                       * auVar67._0_4_ + 1.0;
                  auVar47._4_4_ =
                       (fVar52 + 1.0 +
                       (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) * fVar52
                         + 0.041665796) * fVar52 + 0.16666666) * fVar52 + fVar5) * fVar52 * fVar52)
                       * auVar67._4_4_ + 1.0;
                  auVar47._8_4_ =
                       (fVar53 + 1.0 +
                       (((((fVar53 * 0.00019875691 + 0.0013981999) * fVar53 + 0.008333452) * fVar53
                         + 0.041665796) * fVar53 + 0.16666666) * fVar53 + fVar11) * fVar53 * fVar53)
                       * auVar67._8_4_ + 1.0;
                  auVar47._12_4_ =
                       (fVar54 + 1.0 +
                       (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54
                         + 0.041665796) * fVar54 + 0.16666666) * fVar54 + fVar12) * fVar54 * fVar54)
                       * auVar67._12_4_ + 1.0;
                  auVar63._8_4_ = 0x40000000;
                  auVar63._0_8_ = 0x4000000040000000;
                  auVar63._12_4_ = 0x40000000;
                  auVar67 = vdivps_avx(auVar63,auVar47);
                  auVar48._0_4_ = auVar67._0_4_ + -1.0;
                  auVar48._4_4_ = auVar67._4_4_ + -1.0;
                  auVar48._8_4_ = auVar67._8_4_ + -1.0;
                  auVar48._12_4_ = auVar67._12_4_ + -1.0;
                  goto LAB_003f7f4b;
                case 6:
                  pfVar1 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
                  fVar4 = *pfVar1;
                  fVar5 = pfVar1[1];
                  auVar51._0_4_ = fVar4 * auVar39._0_4_ + fVar5;
                  auVar51._4_4_ = fVar4 * fVar38 + fVar5;
                  auVar51._8_4_ = fVar4 * fVar42 + fVar5;
                  auVar51._12_4_ = fVar4 * fVar43 + fVar5;
                  auVar67 = vmaxps_avx(auVar51,_DAT_005a4060);
                  auVar48 = vminps_avx(auVar67,auVar65);
LAB_003f7f4b:
                  auVar39._0_4_ = auVar48._0_4_ * auVar39._0_4_;
                  auVar39._4_4_ = auVar48._4_4_ * fVar38;
                  auVar39._8_4_ = auVar48._8_4_ * fVar42;
                  auVar39._12_4_ = auVar48._12_4_ * fVar43;
                }
                *(undefined1 (*) [16])((long)pvVar34 + uVar32 * 0x10) = auVar39;
                uVar32 = uVar32 + 1;
              } while (uVar32 != _w);
            }
            pvVar34 = (void *)((long)pvVar34 + (long)(int)(_w * 4) * 4);
            bVar35 = iVar6 != iVar33;
            iVar6 = iVar6 + 1;
          } while (bVar35);
        }
        local_218 = local_218 + 1;
        iVar21 = iVar21 + uVar25 * 4;
      } while (local_218 != uVar22);
    }
LAB_003f8200:
    if (local_158.data != (void *)0x0) {
      operator_delete(local_158.data,local_158.elemsize - (long)local_158.data);
    }
  }
  iVar19 = 0;
LAB_003f78cf:
  piVar7 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}